

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pcons.cc
# Opt level: O1

void * v2i_POLICY_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  char *__s1;
  int iVar1;
  ASN1_VALUE *val;
  size_t sVar2;
  CONF_VALUE *value;
  size_t sVar3;
  ASN1_VALUE *aint;
  bool bVar4;
  
  val = ASN1_item_new((ASN1_ITEM *)&POLICY_CONSTRAINTS_it);
  if (val != (ASN1_VALUE *)0x0) {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)values);
    bVar4 = sVar2 != 0;
    if (bVar4) {
      sVar2 = 0;
      do {
        value = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)values,sVar2);
        __s1 = value->name;
        iVar1 = strcmp(__s1,"requireExplicitPolicy");
        aint = val;
        if ((iVar1 != 0) &&
           (iVar1 = strcmp(__s1,"inhibitPolicyMapping"), aint = val + 8, iVar1 != 0)) {
          ERR_put_error(0x14,0,0x7b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pcons.cc"
                        ,0x57);
          ERR_add_error_data(6,"section:",value->section,",name:",value->name,",value:",value->value
                            );
LAB_004b18b5:
          if (bVar4) goto LAB_004b18ea;
          break;
        }
        iVar1 = X509V3_get_value_int(value,(ASN1_INTEGER **)aint);
        if (iVar1 == 0) goto LAB_004b18b5;
        sVar2 = sVar2 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)values);
        bVar4 = sVar2 < sVar3;
      } while (bVar4);
    }
    if (*(long *)(val + 8) != 0) {
      return val;
    }
    if (*(long *)val != 0) {
      return val;
    }
    ERR_put_error(0x14,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pcons.cc"
                  ,0x5d);
LAB_004b18ea:
    ASN1_item_free(val,(ASN1_ITEM *)&POLICY_CONSTRAINTS_it);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_POLICY_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                    const X509V3_CTX *ctx,
                                    const STACK_OF(CONF_VALUE) *values) {
  POLICY_CONSTRAINTS *pcons = NULL;
  if (!(pcons = POLICY_CONSTRAINTS_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(values, i);
    if (!strcmp(val->name, "requireExplicitPolicy")) {
      if (!X509V3_get_value_int(val, &pcons->requireExplicitPolicy)) {
        goto err;
      }
    } else if (!strcmp(val->name, "inhibitPolicyMapping")) {
      if (!X509V3_get_value_int(val, &pcons->inhibitPolicyMapping)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(val);
      goto err;
    }
  }
  if (!pcons->inhibitPolicyMapping && !pcons->requireExplicitPolicy) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_ILLEGAL_EMPTY_EXTENSION);
    goto err;
  }

  return pcons;
err:
  POLICY_CONSTRAINTS_free(pcons);
  return NULL;
}